

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

char_t * pugi::impl::anon_unknown_0::
         strconv_attribute_impl<pugi::impl::(anonymous_namespace)::opt_true>::parse_wconv
                   (char_t *s,char_t end_quote)

{
  size_t sVar1;
  byte *s_00;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  gap g;
  gap local_38;
  
  local_38.end = (char_t *)0x0;
  local_38.size = 0;
  do {
    while( true ) {
      sVar1 = local_38.size;
      bVar3 = *s;
      bVar4 = (anonymous_namespace)::chartype_table[bVar3];
      s_00 = (byte *)s;
      if ((bVar4 & 4) == 0) break;
LAB_00128db3:
      if (bVar3 == end_quote) {
        pbVar2 = s_00;
        if ((byte *)local_38.end != (byte *)0x0) {
          memmove(local_38.end + -local_38.size,local_38.end,(long)s_00 - (long)local_38.end);
          pbVar2 = s_00 + -sVar1;
        }
        *pbVar2 = 0;
        return (char_t *)(s_00 + 1);
      }
      if ((bVar4 & 8) == 0) {
        if (bVar3 == 0x26) {
          s = strconv_escape((char_t *)s_00,&local_38);
        }
        else {
          if (bVar3 == 0) {
            return (char_t *)0x0;
          }
          s = (char_t *)(s_00 + 1);
        }
      }
      else {
        s = (char_t *)(s_00 + 1);
        *s_00 = 0x20;
        if ((bVar3 == 0xd) && (*s == 10)) {
          if ((byte *)local_38.end != (byte *)0x0) {
            memmove(local_38.end + -local_38.size,local_38.end,(long)s - (long)local_38.end);
          }
          s = (char_t *)(s_00 + 2);
          local_38.size = sVar1 + 1;
          local_38.end = s;
        }
      }
    }
    bVar3 = ((byte *)s)[1];
    bVar4 = (anonymous_namespace)::chartype_table[bVar3];
    if ((bVar4 & 4) != 0) {
      s_00 = (byte *)s + 1;
      goto LAB_00128db3;
    }
    bVar3 = ((byte *)s)[2];
    bVar4 = (anonymous_namespace)::chartype_table[bVar3];
    if ((bVar4 & 4) != 0) {
      s_00 = (byte *)s + 2;
      goto LAB_00128db3;
    }
    bVar3 = ((byte *)s)[3];
    bVar4 = (anonymous_namespace)::chartype_table[bVar3];
    if ((bVar4 & 4) != 0) {
      s_00 = (byte *)s + 3;
      goto LAB_00128db3;
    }
    s = (char_t *)((byte *)s + 4);
  } while( true );
}

Assistant:

static char_t* parse_wconv(char_t* s, char_t end_quote)
		{
			gap g;

			while (true)
			{
				PUGI_IMPL_SCANWHILE_UNROLL(!PUGI_IMPL_IS_CHARTYPE(ss, ct_parse_attr_ws));

				if (*s == end_quote)
				{
					*g.flush(s) = 0;

					return s + 1;
				}
				else if (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
				{
					if (*s == '\r')
					{
						*s++ = ' ';

						if (*s == '\n') g.push(s, 1);
					}
					else *s++ = ' ';
				}
				else if (opt_escape::value && *s == '&')
				{
					s = strconv_escape(s, g);
				}
				else if (!*s)
				{
					return NULL;
				}
				else ++s;
			}
		}